

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CovergroupDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CovergroupDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::FunctionPortListSyntax*&,slang::syntax::SyntaxNode*&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,FunctionPortListSyntax **args_3,SyntaxNode **args_4,
          Token *args_5,SyntaxList<slang::syntax::MemberSyntax> *args_6,Token *args_7,
          NamedBlockClauseSyntax **args_8)

{
  Token name;
  Token covergroup;
  Token semi;
  Token endgroup;
  CovergroupDeclarationSyntax *this_00;
  
  this_00 = (CovergroupDeclarationSyntax *)allocate(this,200,8);
  covergroup.kind = args_1->kind;
  covergroup._2_1_ = args_1->field_0x2;
  covergroup.numFlags.raw = (args_1->numFlags).raw;
  covergroup.rawLen = args_1->rawLen;
  covergroup.info = args_1->info;
  name.kind = args_2->kind;
  name._2_1_ = args_2->field_0x2;
  name.numFlags.raw = (args_2->numFlags).raw;
  name.rawLen = args_2->rawLen;
  name.info = args_2->info;
  endgroup.kind = args_7->kind;
  endgroup._2_1_ = args_7->field_0x2;
  endgroup.numFlags.raw = (args_7->numFlags).raw;
  endgroup.rawLen = args_7->rawLen;
  endgroup.info = args_7->info;
  semi.kind = args_5->kind;
  semi._2_1_ = args_5->field_0x2;
  semi.numFlags.raw = (args_5->numFlags).raw;
  semi.rawLen = args_5->rawLen;
  semi.info = args_5->info;
  slang::syntax::CovergroupDeclarationSyntax::CovergroupDeclarationSyntax
            (this_00,args,covergroup,name,*args_3,*args_4,semi,args_6,endgroup,*args_8);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }